

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void integer_suite::test_zero_white(void)

{
  char input [6];
  decoder_type decoder;
  long local_178;
  undefined4 local_16c;
  value_type local_168 [8];
  basic_decoder<char> local_160;
  
  builtin_memcpy(local_168,"  0  ",6);
  trial::protocol::json::detail::basic_decoder<char>::basic_decoder<6ul>
            (&local_160,(value_type (*) [6])local_168);
  local_178 = CONCAT44(local_178._4_4_,local_160.current.code);
  local_16c = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x196,"void integer_suite::test_zero_white()",&local_178,&local_16c);
  local_178 = trial::protocol::json::detail::basic_decoder<char>::signed_value<long>(&local_160);
  local_16c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("decoder.signed_value<std::int64_t>()","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x197,"void integer_suite::test_zero_white()",&local_178,&local_16c);
  trial::protocol::json::detail::basic_decoder<char>::next(&local_160);
  local_178 = CONCAT44(local_178._4_4_,local_160.current.code);
  local_16c = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x199,"void integer_suite::test_zero_white()",&local_178,&local_16c);
  return;
}

Assistant:

void test_zero_white()
{
    const char input[] = "  0  ";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.signed_value<std::int64_t>(), 0);
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}